

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XTemplateSerializer.cpp
# Opt level: O3

void xercesc_4_0::XTemplateSerializer::loadObject
               (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> **objToLoad,
               int param_2,bool toAdopt,XSerializeEngine *serEng)

{
  bool bVar1;
  int iVar2;
  MemoryManager *pMVar3;
  RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *pRVar4;
  DTDAttDef *valueToAdopt;
  undefined4 extraout_var;
  XSerializeEngine *__nbytes;
  void *extraout_RDX;
  void *__buf;
  void *extraout_RDX_00;
  ulong uVar5;
  XMLSize_t itemNumber;
  XMLSize_t hashModulus;
  XMLSize_t local_40;
  XMLSize_t local_38;
  
  __nbytes = serEng;
  bVar1 = XSerializeEngine::needToLoadObject(serEng,objToLoad);
  if (bVar1) {
    XSerializeEngine::readSize(serEng,&local_38);
    pRVar4 = *objToLoad;
    if (pRVar4 == (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)0x0) {
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      pRVar4 = (RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher> *)
               XMemory::operator_new(0x38,pMVar3);
      pMVar3 = XSerializeEngine::getMemoryManager(serEng);
      pRVar4->fMemoryManager = pMVar3;
      pRVar4->fAdoptedElems = toAdopt;
      pRVar4->fBucketList = (RefHashTableBucketElem<xercesc_4_0::DTDAttDef> **)0x0;
      pRVar4->fHashModulus = local_38;
      pRVar4->fInitialModulus = local_38;
      pRVar4->fCount = 0;
      RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::initialize(pRVar4,local_38)
      ;
      *objToLoad = pRVar4;
    }
    XSerializeEngine::registerObject(serEng,pRVar4);
    local_40 = 0;
    XSerializeEngine::readSize(serEng,&local_40);
    if (local_40 != 0) {
      uVar5 = 0;
      __buf = extraout_RDX;
      do {
        valueToAdopt = (DTDAttDef *)XSerializeEngine::read(serEng,0x438a68,__buf,(size_t)__nbytes);
        pRVar4 = *objToLoad;
        iVar2 = (*(valueToAdopt->super_XMLAttDef).super_XSerializable._vptr_XSerializable[5])
                          (valueToAdopt);
        RefHashTableOf<xercesc_4_0::DTDAttDef,_xercesc_4_0::StringHasher>::put
                  (pRVar4,(void *)CONCAT44(extraout_var,iVar2),valueToAdopt);
        uVar5 = uVar5 + 1;
        __buf = extraout_RDX_00;
      } while (uVar5 < local_40);
    }
  }
  return;
}

Assistant:

void XTemplateSerializer::loadObject(RefHashTableOf<DTDAttDef>** objToLoad
                                   , int
                                   , bool                        toAdopt
                                   , XSerializeEngine&           serEng)
{

    if (serEng.needToLoadObject((void**)objToLoad))
    {

        XMLSize_t hashModulus;
        serEng.readSize (hashModulus);

        if (!*objToLoad)
        {
            *objToLoad = new (serEng.getMemoryManager())
                             RefHashTableOf<DTDAttDef>(
                                                       hashModulus
                                                     , toAdopt
                                                     , serEng.getMemoryManager()
                                                      );
        }

        serEng.registerObject(*objToLoad);

        XMLSize_t itemNumber = 0;
        serEng.readSize (itemNumber);

        for (XMLSize_t itemIndex = 0; itemIndex < itemNumber; itemIndex++)
        {
            DTDAttDef*  data;
            serEng>>data;

            (*objToLoad)->put((void*)data->getFullName(), data);
        }
    }
}